

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_connection.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::peer_connection::superseed_piece
          (peer_connection *this,piece_index_t replace_piece,piece_index_t new_piece)

{
  bool bVar1;
  uint uVar2;
  reference pvVar3;
  reference pvVar4;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> local_4c;
  int local_48;
  undefined1 local_38 [8];
  shared_ptr<libtorrent::aux::torrent> t;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> local_20;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> local_1c;
  peer_connection *local_18;
  peer_connection *this_local;
  piece_index_t new_piece_local;
  piece_index_t replace_piece_local;
  
  local_18 = this;
  this_local._0_4_ = new_piece.m_val;
  this_local._4_4_ = replace_piece.m_val;
  bVar1 = is_connecting(this);
  if ((!bVar1) &&
     (uVar2 = (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x1b])(), (uVar2 & 1) == 0)) {
    strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::strong_typedef(&local_1c,-1);
    bVar1 = strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::operator==
                      ((strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)&this_local,
                       &local_1c);
    if (bVar1) {
      pvVar3 = ::std::
               array<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_2UL>
               ::operator[](&this->m_superseed_piece,0);
      strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::strong_typedef(&local_20,-1);
      bVar1 = strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::operator==
                        (pvVar3,&local_20);
      if (!bVar1) {
        strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::strong_typedef
                  ((strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)
                   ((long)&t.
                           super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi + 4),-1);
        pvVar3 = ::std::
                 array<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_2UL>
                 ::operator[](&this->m_superseed_piece,0);
        pvVar3->m_val =
             t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi._4_4_;
        strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::strong_typedef
                  ((strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)
                   &t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,-1);
        pvVar3 = ::std::
                 array<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_2UL>
                 ::operator[](&this->m_superseed_piece,1);
        pvVar3->m_val =
             (int)t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
        peer_log(this,info,"SUPER_SEEDING","ending");
        ::std::weak_ptr<libtorrent::aux::torrent>::lock
                  ((weak_ptr<libtorrent::aux::torrent> *)local_38);
        (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x2a])();
        ::std::shared_ptr<libtorrent::aux::torrent>::~shared_ptr
                  ((shared_ptr<libtorrent::aux::torrent> *)local_38);
      }
    }
    else {
      uVar2 = strong_typedef::operator_cast_to_int((strong_typedef *)&this_local);
      peer_log(this,outgoing_message,"HAVE","piece: %d (super seed)",(ulong)uVar2);
      local_48 = this_local._0_4_;
      (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x25])();
      strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::strong_typedef(&local_4c,0);
      bVar1 = strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::operator>=
                        ((strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)
                         ((long)&this_local + 4),&local_4c);
      if (bVar1) {
        pvVar3 = ::std::
                 array<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_2UL>
                 ::operator[](&this->m_superseed_piece,0);
        bVar1 = strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::operator==
                          (pvVar3,(strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)
                                  ((long)&this_local + 4));
        if (bVar1) {
          pvVar3 = ::std::
                   array<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_2UL>
                   ::operator[](&this->m_superseed_piece,0);
          pvVar4 = ::std::
                   array<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_2UL>
                   ::operator[](&this->m_superseed_piece,1);
          ::std::swap<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>>
                    (pvVar3,pvVar4);
        }
      }
      pvVar3 = ::std::
               array<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_2UL>
               ::operator[](&this->m_superseed_piece,0);
      pvVar4 = ::std::
               array<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_2UL>
               ::operator[](&this->m_superseed_piece,1);
      pvVar4->m_val = pvVar3->m_val;
      pvVar3 = ::std::
               array<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_2UL>
               ::operator[](&this->m_superseed_piece,0);
      pvVar3->m_val = this_local._0_4_;
    }
  }
  return;
}

Assistant:

void peer_connection::superseed_piece(piece_index_t const replace_piece
		, piece_index_t const new_piece)
	{
		TORRENT_ASSERT(is_single_thread());

		if (is_connecting()) return;
		if (in_handshake()) return;

		if (new_piece == piece_index_t(-1))
		{
			if (m_superseed_piece[0] == piece_index_t(-1)) return;
			m_superseed_piece[0] = piece_index_t(-1);
			m_superseed_piece[1] = piece_index_t(-1);

#ifndef TORRENT_DISABLE_LOGGING
			peer_log(peer_log_alert::info, "SUPER_SEEDING", "ending");
#endif
			auto t = m_torrent.lock();
			TORRENT_ASSERT(t);

			// this will either send a full bitfield or
			// a have-all message, effectively terminating
			// super-seeding, since the peer may pick any piece
			write_bitfield();

			return;
		}

		TORRENT_ASSERT(!has_piece(new_piece));

#ifndef TORRENT_DISABLE_LOGGING
		peer_log(peer_log_alert::outgoing_message, "HAVE", "piece: %d (super seed)"
			, static_cast<int>(new_piece));
#endif
		write_have(new_piece);

		if (replace_piece >= piece_index_t(0))
		{
			// move the piece we're replacing to the tail
			if (m_superseed_piece[0] == replace_piece)
				std::swap(m_superseed_piece[0], m_superseed_piece[1]);
		}

		m_superseed_piece[1] = m_superseed_piece[0];
		m_superseed_piece[0] = new_piece;
	}